

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_perform_authenticate
                   (connectdata *conn,char *mech,char *initresp,imapstate state1,imapstate state2)

{
  CURLcode CVar1;
  
  if (initresp == (char *)0x0) {
    CVar1 = imap_sendf(conn,"AUTHENTICATE %s",mech);
    state2 = state1;
  }
  else {
    CVar1 = imap_sendf(conn,"AUTHENTICATE %s %s",mech);
  }
  if (CVar1 == CURLE_OK) {
    (conn->proto).imapc.state = state2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode imap_perform_authenticate(struct connectdata *conn,
                                          const char *mech,
                                          const char *initresp,
                                          imapstate state1, imapstate state2)
{
  CURLcode result = CURLE_OK;

  if(initresp) {
    /* Send the AUTHENTICATE command with the initial response */
    result = imap_sendf(conn, "AUTHENTICATE %s %s", mech, initresp);

    if(!result)
      state(conn, state2);
  }
  else {
    /* Send the AUTHENTICATE command */
    result = imap_sendf(conn, "AUTHENTICATE %s", mech);

    if(!result)
      state(conn, state1);
  }

  return result;
}